

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metamakefile.cpp
# Opt level: O3

ssize_t __thiscall
BuildsMetaMakefileGenerator::write
          (BuildsMetaMakefileGenerator *this,int __fd,void *__buf,size_t __n)

{
  QList<BuildsMetaMakefileGenerator::Build_*> *this_00;
  Build *dst;
  QMakeProject *this_01;
  Data *pDVar1;
  char16_t *pcVar2;
  FILE *__stream;
  Data *pDVar3;
  qsizetype qVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  iterator iVar9;
  Build *this_02;
  MakefileGenerator *pMVar10;
  pointer ppBVar11;
  size_t __n_00;
  size_t __n_01;
  byte bVar12;
  undefined7 uVar13;
  byte bVar14;
  void *__buf_00;
  undefined1 *__buf_01;
  ulong uVar15;
  long in_FS_OFFSET;
  bool bVar16;
  QByteArrayView QVar17;
  ProKey local_c8;
  ProString local_98;
  QString local_68;
  QArrayData *local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->makefiles;
  if ((this->makefiles).d.size == 0) {
    this_02 = (Build *)0x0;
  }
  else {
    iVar9 = QList<BuildsMetaMakefileGenerator::Build_*>::begin(this_00);
    this_02 = (Build *)0x0;
    if ((((*iVar9.i)->build).d.ptr != (char16_t *)0x0) && (Option::qmake_mode != QMAKE_GENERATE_PRL)
       ) {
      this_02 = (Build *)operator_new(0x38);
      (this_02->name).d.d = (Data *)0x0;
      (this_02->name).d.ptr = (char16_t *)0x0;
      (this_02->name).d.size = 0;
      (this_02->build).d.d = (Data *)0x0;
      (this_02->build).d.ptr = (char16_t *)0x0;
      (this_02->build).d.size = 0;
      QString::operator=((QString *)this_02,(QString *)&(this->super_MetaMakefileGenerator).name);
      pMVar10 = MetaMakefileGenerator::createMakefileGenerator
                          ((this->super_MetaMakefileGenerator).project,true);
      this_02->makefile = pMVar10;
      local_98.m_string.d.d = (Data *)this_02;
      QtPrivate::QPodArrayOps<BuildsMetaMakefileGenerator::Build*>::
      emplace<BuildsMetaMakefileGenerator::Build*&>
                ((QPodArrayOps<BuildsMetaMakefileGenerator::Build*> *)this_00,
                 (this->makefiles).d.size,(Build **)&local_98);
      QList<BuildsMetaMakefileGenerator::Build_*>::end(this_00);
    }
  }
  QFile::fileName();
  uVar15 = 0;
  iVar7 = 1;
  do {
    bVar14 = (byte)iVar7;
    if ((ulong)(this->makefiles).d.size <= uVar15) goto LAB_00198821;
    QFile::setFileName((QString *)Option::output);
    ppBVar11 = QList<BuildsMetaMakefileGenerator::Build_*>::data(this_00);
    dst = ppBVar11[uVar15];
    if (dst->makefile == (MakefileGenerator *)0x0) {
      bVar14 = 0;
      goto LAB_00198821;
    }
    bVar16 = true;
    if (Option::qmake_mode - QMAKE_GENERATE_PROJECT < 2) {
      iVar7 = (*(dst->makefile->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x1d])();
      if ((char)iVar7 != '\0') {
        iVar7 = (*(dst->makefile->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x1d])();
        if (((char)iVar7 == '\0') || (this_02 != (Build *)0x0 && dst != this_02)) goto LAB_00198711;
      }
      cVar5 = QIODevice::isOpen();
      if (cVar5 == '\0') {
        QFile::fileName();
        bVar6 = comparesEqual(&local_98.m_string,"-");
        if ((Build *)local_98.m_string.d.d != (Build *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (bVar6) {
          QVar17.m_data = (storage_type *)0x0;
          QVar17.m_size = (qsizetype)&local_98;
          QString::fromUtf8(QVar17);
          local_c8.super_ProString.m_string.d.d = local_98.m_string.d.d;
          local_c8.super_ProString.m_string.d.ptr = local_98.m_string.d.ptr;
          local_c8.super_ProString.m_string.d.size = local_98.m_string.d.size;
          QFile::setFileName((QString *)Option::output);
          if ((Build *)local_c8.super_ProString.m_string.d.d != (Build *)0x0) {
            LOCK();
            *(int *)&(((QString *)&(local_c8.super_ProString.m_string.d.d)->super_QArrayData)->d).d
                 = *(int *)&(((QString *)&(local_c8.super_ProString.m_string.d.d)->super_QArrayData)
                            ->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&(local_c8.super_ProString.m_string.d.d)->super_QArrayData)->d
                         ).d == 0) {
              QArrayData::deallocate
                        (&(local_c8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          qmake_getpwd();
          qVar4 = local_98.m_string.d.size;
          pDVar3 = local_98.m_string.d.d;
          pcVar2 = Option::output_dir.d.ptr;
          pDVar1 = Option::output_dir.d.d;
          local_98.m_string.d.d = Option::output_dir.d.d;
          Option::output_dir.d.d = pDVar3;
          Option::output_dir.d.ptr = local_98.m_string.d.ptr;
          local_98.m_string.d.ptr = pcVar2;
          local_98.m_string.d.size = Option::output_dir.d.size;
          Option::output_dir.d.size = qVar4;
          if (pDVar1 != (Data *)0x0) {
            LOCK();
            (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar1->super_QArrayData,2,0x10);
            }
          }
          iVar7 = 0x2e5c98;
          __buf_00 = _stdout;
          cVar5 = QFile::open(Option::output,_stdout,0x12,0);
          if (cVar5 != '\0') goto LAB_00198711;
          write(iVar7,__buf_00,__n_00);
        }
        else {
          QFile::fileName();
          bVar16 = local_98.m_string.d.size == 0;
          bVar6 = Option::qmake_mode == QMAKE_GENERATE_MAKEFILE;
          if ((Build *)local_98.m_string.d.d != (Build *)0x0) {
            LOCK();
            *(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d =
                 *(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d == 0) {
              QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (bVar16 && bVar6) {
            this_01 = (this->super_MetaMakefileGenerator).project;
            ProKey::ProKey(&local_c8,"QMAKE_MAKEFILE");
            QMakeEvaluator::first(&local_98,&this_01->super_QMakeEvaluator,&local_c8);
            ProString::toQString(&local_68,&local_98);
            QFile::setFileName((QString *)Option::output);
            if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((Build *)local_98.m_string.d.d != (Build *)0x0) {
              LOCK();
              *(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d =
                   *(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d == 0) {
                QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((Build *)local_c8.super_ProString.m_string.d.d != (Build *)0x0) {
              LOCK();
              *(int *)&(((QString *)&(local_c8.super_ProString.m_string.d.d)->super_QArrayData)->d).
                       d = *(int *)&(((QString *)
                                     &(local_c8.super_ProString.m_string.d.d)->super_QArrayData)->d)
                                    .d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)&(local_c8.super_ProString.m_string.d.d)->super_QArrayData)
                           ->d).d == 0) {
                QArrayData::deallocate
                          (&(local_c8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          local_98.m_string.d.d = (dst->name).d.d;
          local_98.m_string.d.ptr = (dst->name).d.ptr;
          local_98.m_string.d.size = (dst->name).d.size;
          if ((Build *)local_98.m_string.d.d != (Build *)0x0) {
            LOCK();
            *(int *)&(((Build *)local_98.m_string.d.d)->name).d.d =
                 *(int *)&(((Build *)local_98.m_string.d.d)->name).d.d + 1;
            UNLOCK();
          }
          if ((dst->build).d.size != 0) {
            if (local_98.m_string.d.size != 0) {
              QString::append(&local_98,".",1);
            }
            QString::append((QString *)&local_98);
          }
          iVar7 = (*(dst->makefile->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x1f])
                            (dst->makefile,Option::output,&local_98);
          __stream = _stderr;
          if ((char)iVar7 != '\0') {
            if ((Build *)local_98.m_string.d.d != (Build *)0x0) {
              LOCK();
              *(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d =
                   *(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d == 0) {
                QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            goto LAB_0019840f;
          }
          __buf_01 = Option::output;
          QFile::fileName();
          if (local_c8.super_ProString.m_string.d.size == 0) {
            fprintf(__stream,"Failure to open file: %s\n","(stdout)");
          }
          else {
            write((int)__stream,__buf_01,__n_01);
          }
          if ((Build *)local_c8.super_ProString.m_string.d.d != (Build *)0x0) {
            LOCK();
            *(int *)&(((QString *)&(local_c8.super_ProString.m_string.d.d)->super_QArrayData)->d).d
                 = *(int *)&(((QString *)&(local_c8.super_ProString.m_string.d.d)->super_QArrayData)
                            ->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&(local_c8.super_ProString.m_string.d.d)->super_QArrayData)->d
                         ).d == 0) {
              QArrayData::deallocate
                        (&(local_c8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((Build *)local_98.m_string.d.d != (Build *)0x0) {
            LOCK();
            *(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d =
                 *(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d == 0) {
              QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        bVar12 = 0;
        uVar13 = 0;
        goto LAB_00198823;
      }
LAB_0019840f:
      bVar16 = false;
    }
LAB_00198711:
    if (dst->makefile == (MakefileGenerator *)0x0) {
      iVar7 = 0;
    }
    else if (dst == this_02) {
      checkForConflictingTargets(this);
      ProKey::ProKey((ProKey *)&local_98,"QMAKE_INTERNAL_INCLUDED_FILES");
      accumulateVariableFromBuilds(this,(ProKey *)&local_98,dst);
      if ((Build *)local_98.m_string.d.d != (Build *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      iVar7 = (*(dst->makefile->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x1b])();
    }
    else {
      iVar7 = (*(dst->makefile->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x1a])();
      if ((this_02 != (Build *)0x0) &&
         (iVar8 = (*(this_02->makefile->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x1d])
                            (), (char)iVar8 != '\0')) {
        iVar7 = (*(this_02->makefile->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x1e])
                          (this_02->makefile,dst->makefile);
      }
    }
    if ((!bVar16) && (QFileDevice::close(), (char)iVar7 == '\0')) {
      QFile::remove();
    }
    uVar15 = uVar15 + 1;
  } while ((char)iVar7 != '\0');
  bVar14 = 0;
LAB_00198821:
  uVar13 = (undefined7)((ulong)this_00 >> 8);
  bVar12 = 1;
LAB_00198823:
  if (local_50 != (QArrayData *)0x0) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return CONCAT71(uVar13,bVar12 & bVar14) & 0xffffffff;
  }
  __stack_chk_fail();
}

Assistant:

bool
BuildsMetaMakefileGenerator::write()
{
    Build *glue = nullptr;
    if(!makefiles.isEmpty() && !makefiles.first()->build.isNull()
        && Option::qmake_mode != Option::QMAKE_GENERATE_PRL) {
        glue = new Build;
        glue->name = name;
        glue->makefile = createMakefileGenerator(project, true);
        makefiles += glue;
    }

    bool ret = true;
    const QString &output_name = Option::output.fileName();
    for(int i = 0; ret && i < makefiles.size(); i++) {
        Option::output.setFileName(output_name);
        Build *build = makefiles[i];

        bool using_stdout = false;
        if(build->makefile && (Option::qmake_mode == Option::QMAKE_GENERATE_MAKEFILE ||
                               Option::qmake_mode == Option::QMAKE_GENERATE_PROJECT)
           && (!build->makefile->supportsMergedBuilds()
            || (build->makefile->supportsMergedBuilds() && (!glue || build == glue)))) {
            //open output
            if(!(Option::output.isOpen())) {
                if(Option::output.fileName() == "-") {
                    Option::output.setFileName("");
                    Option::output_dir = qmake_getpwd();
                    if (!Option::output.open(stdout, QIODevice::WriteOnly | QIODevice::Text)) {
                        fprintf(stderr, "Failure to open stdout\n");
                        return false;
                    }
                    using_stdout = true;
                } else {
                    if(Option::output.fileName().isEmpty() &&
                       Option::qmake_mode == Option::QMAKE_GENERATE_MAKEFILE)
                        Option::output.setFileName(project->first("QMAKE_MAKEFILE").toQString());
                    QString build_name = build->name;
                    if(!build->build.isEmpty()) {
                        if(!build_name.isEmpty())
                            build_name += ".";
                        build_name += build->build;
                    }
                    if(!build->makefile->openOutput(Option::output, build_name)) {
                        fprintf(stderr, "Failure to open file: %s\n",
                                Option::output.fileName().isEmpty() ? "(stdout)" :
                                Option::output.fileName().toLatin1().constData());
                        return false;
                    }
                }
            }
        } else {
           using_stdout = true; //kind of..
        }

        if(!build->makefile) {
            ret = false;
        } else if(build == glue) {
            checkForConflictingTargets();
            accumulateVariableFromBuilds("QMAKE_INTERNAL_INCLUDED_FILES", build);
            ret = build->makefile->writeProjectMakefile();
        } else {
            ret = build->makefile->write();
            if (glue && glue->makefile->supportsMergedBuilds())
                ret = glue->makefile->mergeBuildProject(build->makefile);
        }
        if(!using_stdout) {
            Option::output.close();
            if(!ret)
                Option::output.remove();
        }
    }
    return ret;
}